

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_2_class_declare(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  PVIPNode *local_48;
  PVIPNode *local_38;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  if (G->val[-3] == (PVIPNode *)0x0) {
    local_38 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_38 = G->val[-3];
  }
  if (G->val[-2] == (PVIPNode *)0x0) {
    local_48 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_48 = G->val[-2];
  }
  pPVar1 = PVIP_node_new_children3(&G->data,PVIP_NODE_CLASS,local_38,local_48,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_class_declare(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define is G->val[-2]
#define i G->val[-3]
  yyprintf((stderr, "do yy_2_class_declare"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = PVIP_node_new_children3(&(G->data), \n\
            PVIP_NODE_CLASS,\n\
            MAYBE(i),\n\
            MAYBE(is),\n\
            b\n\
        );\n\
    }\n"));
  
        yy = PVIP_node_new_children3(&(G->data), 
            PVIP_NODE_CLASS,
            MAYBE(i),
            MAYBE(is),
            b
        );
    ;
#undef b
#undef is
#undef i
}